

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_glows.cxx
# Opt level: O0

void __thiscall
xray_re::xr_level_glows::load(xr_level_glows *this,uint32_t xrlc_version,xr_reader *r)

{
  xr_reader *local_28;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_glows *pxStack_10;
  uint32_t xrlc_version_local;
  xr_level_glows *this_local;
  
  local_28 = (xr_reader *)0x0;
  s = r;
  r_local._4_4_ = xrlc_version;
  pxStack_10 = this;
  if (xrlc_version < 10) {
    if (xrlc_version == 5) {
      local_28 = xr_reader::open_chunk(r,10);
    }
    else {
      local_28 = xr_reader::open_chunk(r,9);
    }
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_glows.cxx"
                    ,0x32,"void xray_re::xr_level_glows::load(uint32_t, xr_reader &)");
    }
    load_v5(this,local_28);
  }
  else if ((xrlc_version == 10) || (xrlc_version == 0xb)) {
    local_28 = xr_reader::open_chunk(r,7);
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_glows.cxx"
                    ,0x36,"void xray_re::xr_level_glows::load(uint32_t, xr_reader &)");
    }
    load_v5(this,local_28);
  }
  else {
    local_28 = xr_reader::open_chunk(r,7);
    if (local_28 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_glows.cxx"
                    ,0x3a,"void xray_re::xr_level_glows::load(uint32_t, xr_reader &)");
    }
    load_v13(this,local_28);
  }
  xr_reader::close_chunk(s,&local_28);
  return;
}

Assistant:

void xr_level_glows::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version <= XRLC_VERSION_9) {
		if (xrlc_version == XRLC_VERSION_5)
			s = r.open_chunk(FSL5_GLOWS);
		else
			s = r.open_chunk(FSL8_GLOWS);
		xr_assert(s);
		load_v5(*s);
	} else if (xrlc_version == XRLC_VERSION_10 || xrlc_version == XRLC_VERSION_11) {
		s = r.open_chunk(FSL10_GLOWS);
		xr_assert(s);
		load_v5(*s);
	} else {
		s = r.open_chunk(FSL13_GLOWS);
		xr_assert(s);
		load_v13(*s);
	}
	r.close_chunk(s);
}